

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-lexer.cc
# Opt level: O0

ReservedChars __thiscall wabt::WastLexer::ReadReservedChars(WastLexer *this)

{
  bool bVar1;
  Token local_58;
  int local_18;
  ReservedChars local_14;
  int peek;
  ReservedChars ret;
  WastLexer *this_local;
  
  local_14 = None;
  _peek = this;
  while( true ) {
    while( true ) {
      local_18 = PeekChar(this);
      bVar1 = IsIdChar(local_18);
      if (!bVar1) break;
      ReadChar(this);
      if (local_14 == None) {
        local_14 = Id;
      }
    }
    if (local_18 != 0x22) break;
    GetStringToken(&local_58,this);
    local_14 = Some;
  }
  return local_14;
}

Assistant:

WastLexer::ReservedChars WastLexer::ReadReservedChars() {
  ReservedChars ret{ReservedChars::None};
  while (true) {
    auto peek = PeekChar();
    if (IsIdChar(peek)) {
      ReadChar();
      if (ret == ReservedChars::None) {
        ret = ReservedChars::Id;
      }
    } else if (peek == '"') {
      GetStringToken();
      ret = ReservedChars::Some;
    } else {
      break;
    }
  }
  return ret;
}